

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O1

BrotliDecoderResult
BrotliDecoderDecompress
          (size_t encoded_size,uint8_t *encoded_buffer,size_t *decoded_size,uint8_t *decoded_buffer,
          int save_info_for_recompression,BackwardReferenceFromDecoder **backward_references,
          size_t *backward_references_size,BlockSplitFromDecoder *literals_block_splits,
          BlockSplitFromDecoder *insert_copy_length_block_splits)

{
  int iVar1;
  BrotliDecoderResult BVar2;
  bool bVar3;
  size_t available_in;
  size_t total_out;
  BrotliDecoderStateInternal s;
  uint8_t *local_1510;
  size_t local_1508;
  uint8_t *local_1500;
  size_t local_14f8;
  size_t local_14f0;
  BrotliDecoderStateInternal local_14e8;
  
  local_14f0 = 0;
  local_1508 = *decoded_size;
  local_14e8._824_2_ =
       local_14e8._824_2_ & 0xffbf | (ushort)((save_info_for_recompression & 1U) << 6);
  bVar3 = false;
  local_1510 = decoded_buffer;
  local_1500 = encoded_buffer;
  local_14f8 = encoded_size;
  iVar1 = BrotliDecoderStateInit
                    (&local_14e8,(brotli_alloc_func)0x0,(brotli_free_func)0x0,(void *)0x0);
  if (iVar1 != 0) {
    BVar2 = BrotliDecoderDecompressStream
                      (&local_14e8,&local_14f8,&local_1500,&local_1508,&local_1510,&local_14f0);
    *decoded_size = local_14f0;
    BrotliDecoderStateCleanup(&local_14e8);
    bVar3 = BVar2 == BROTLI_DECODER_RESULT_SUCCESS;
    if ((local_14e8._824_4_ & 0x40) != 0) {
      *backward_references = local_14e8.commands;
      *backward_references_size = local_14e8.commands_size;
      literals_block_splits->types_alloc_size = local_14e8.literals_block_splits.types_alloc_size;
      literals_block_splits->positions_alloc_size =
           local_14e8.literals_block_splits.positions_alloc_size;
      literals_block_splits->positions_begin = local_14e8.literals_block_splits.positions_begin;
      literals_block_splits->positions_end = local_14e8.literals_block_splits.positions_end;
      literals_block_splits->num_blocks = local_14e8.literals_block_splits.num_blocks;
      literals_block_splits->types = local_14e8.literals_block_splits.types;
      literals_block_splits->num_types = local_14e8.literals_block_splits.num_types;
      literals_block_splits->num_types_prev_metablocks =
           local_14e8.literals_block_splits.num_types_prev_metablocks;
      insert_copy_length_block_splits->types_alloc_size =
           local_14e8.insert_copy_length_block_splits.types_alloc_size;
      insert_copy_length_block_splits->positions_alloc_size =
           local_14e8.insert_copy_length_block_splits.positions_alloc_size;
      insert_copy_length_block_splits->positions_begin =
           local_14e8.insert_copy_length_block_splits.positions_begin;
      insert_copy_length_block_splits->positions_end =
           local_14e8.insert_copy_length_block_splits.positions_end;
      insert_copy_length_block_splits->num_blocks =
           local_14e8.insert_copy_length_block_splits.num_blocks;
      insert_copy_length_block_splits->types = local_14e8.insert_copy_length_block_splits.types;
      insert_copy_length_block_splits->num_types =
           local_14e8.insert_copy_length_block_splits.num_types;
      insert_copy_length_block_splits->num_types_prev_metablocks =
           local_14e8.insert_copy_length_block_splits.num_types_prev_metablocks;
    }
  }
  return (BrotliDecoderResult)bVar3;
}

Assistant:

BrotliDecoderResult BrotliDecoderDecompress(
    size_t encoded_size, const uint8_t* encoded_buffer, size_t* decoded_size,
    uint8_t* decoded_buffer, BROTLI_BOOL save_info_for_recompression,
    BackwardReferenceFromDecoder** backward_references,
    size_t* backward_references_size,
    BlockSplitFromDecoder* literals_block_splits,
    BlockSplitFromDecoder* insert_copy_length_block_splits) {
  BrotliDecoderState s;
  BrotliDecoderResult result;
  size_t total_out = 0;
  size_t available_in = encoded_size;
  const uint8_t* next_in = encoded_buffer;
  size_t available_out = *decoded_size;
  uint8_t* next_out = decoded_buffer;
  s.save_info_for_recompression = save_info_for_recompression;

  if (!BrotliDecoderStateInit(&s, 0, 0, 0)) {
    return BROTLI_DECODER_RESULT_ERROR;
  }
  result = BrotliDecoderDecompressStream(
      &s, &available_in, &next_in, &available_out, &next_out, &total_out);
  *decoded_size = total_out;
  BrotliDecoderStateCleanup(&s);
  if (result != BROTLI_DECODER_RESULT_SUCCESS) {
    result = BROTLI_DECODER_RESULT_ERROR;
  }
  if (s.save_info_for_recompression) {
    *backward_references = s.commands;
    *backward_references_size = s.commands_size;
    *literals_block_splits = s.literals_block_splits;
    *insert_copy_length_block_splits = s.insert_copy_length_block_splits;
  }


  return result;
}